

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

TestCaseGroup * vkt::SpirVAssembly::createShaderDefaultOutputGroup(TestContext *testCtx)

{
  deInt32 *pdVar1;
  deUint32 dVar2;
  TestNode *this;
  long *plVar3;
  mapped_type *pmVar4;
  SpvAsmComputeShaderCase *this_00;
  long *plVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar6;
  int iVar7;
  NumberType type;
  SpirVAssembly *this_01;
  string description;
  string typeName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  Random rnd;
  undefined1 local_1e8 [8];
  SharedPtrStateBase *pSStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Base_ptr local_1c8;
  size_t sStack_1c0;
  string local_1b8;
  TestNode *local_198;
  float local_18c;
  TestNode *local_188;
  TestContext *local_180;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  string local_158;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  deRandom local_108;
  undefined1 local_f8 [64];
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  local_b8;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  local_a0;
  int local_88 [4];
  pointer local_78;
  pointer local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  code *local_38;
  
  this = (TestNode *)operator_new(0x70);
  local_180 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"shader_default_output","Test shader default output.");
  local_188 = this;
  dVar2 = deStringHash((this->m_name)._M_dataplus._M_p);
  deRandom_init(&local_108,dVar2);
  this_01 = (SpirVAssembly *)0x0;
  uVar6 = extraout_RDX;
  do {
    type = (NumberType)this_01;
    getNumberTypeName_abi_cxx11_(&local_158,this_01,(NumberType)uVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "Test the OpVariable initializer with ",&local_158);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_f8);
    local_178 = &local_168;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_168 = *plVar5;
      lStack_160 = plVar3[3];
    }
    else {
      local_168 = *plVar5;
      local_178 = (long *)*plVar3;
    }
    local_170 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    local_198 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_198,local_180,local_158._M_dataplus._M_p,(char *)local_178);
    iVar7 = 1;
    do {
      ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)local_f8);
      local_88[0] = 1;
      local_88[1] = 1;
      local_88[2] = 1;
      local_138._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_138._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_138._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_138._M_impl.super__Rb_tree_header._M_header;
      local_138._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_138._M_impl.super__Rb_tree_header._M_header._M_right =
           local_138._M_impl.super__Rb_tree_header._M_header._M_left;
      if (type == TYPE_INT) {
        dVar2 = deRandom_getUint32(&local_108);
        createCompositeBuffer<int>((SpirVAssembly *)local_1e8,dVar2);
        std::
        vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
        ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                  ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                    *)&local_b8,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)local_1e8);
        if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &pSStack_1e0->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_1e8 = (undefined1  [8])0x0;
            (*pSStack_1e0->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &pSStack_1e0->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
              (*pSStack_1e0->_vptr_SharedPtrStateBase[1])();
            }
            pSStack_1e0 = (SharedPtrStateBase *)0x0;
          }
        }
        createCompositeBuffer<int>((SpirVAssembly *)local_1e8,dVar2);
        std::
        vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
        ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                  ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                    *)&local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)local_1e8);
        if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &pSStack_1e0->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_1e8 = (undefined1  [8])0x0;
            (*pSStack_1e0->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &pSStack_1e0->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
              (*pSStack_1e0->_vptr_SharedPtrStateBase[1])();
            }
            pSStack_1e0 = (SharedPtrStateBase *)0x0;
          }
        }
        numberToString<int>((string *)local_1e8,dVar2);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"constValue","");
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_138,&local_1b8);
        std::__cxx11::string::_M_assign((string *)pmVar4);
LAB_0056efca:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if (local_1e8 != (undefined1  [8])&local_1d8) {
          operator_delete((void *)local_1e8,local_1d8._M_allocated_capacity + 1);
        }
      }
      else {
        if (type == TYPE_UINT) {
          dVar2 = deRandom_getUint32(&local_108);
          createCompositeBuffer<unsigned_int>((SpirVAssembly *)local_1e8,dVar2);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)&local_b8,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)local_1e8);
          if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &pSStack_1e0->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              local_1e8 = (undefined1  [8])0x0;
              (*pSStack_1e0->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar1 = &pSStack_1e0->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
                (*pSStack_1e0->_vptr_SharedPtrStateBase[1])();
              }
              pSStack_1e0 = (SharedPtrStateBase *)0x0;
            }
          }
          createCompositeBuffer<unsigned_int>((SpirVAssembly *)local_1e8,dVar2);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)&local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)local_1e8);
          if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &pSStack_1e0->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              local_1e8 = (undefined1  [8])0x0;
              (*pSStack_1e0->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar1 = &pSStack_1e0->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
                (*pSStack_1e0->_vptr_SharedPtrStateBase[1])();
              }
              pSStack_1e0 = (SharedPtrStateBase *)0x0;
            }
          }
          numberToString<unsigned_int>((string *)local_1e8,dVar2);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"constValue","");
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_138,&local_1b8);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          goto LAB_0056efca;
        }
        if (type == TYPE_FLOAT) {
          local_18c = deRandom_getFloat(&local_108);
          createCompositeBuffer<float>((SpirVAssembly *)local_1e8,local_18c);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)&local_b8,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)local_1e8);
          if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &pSStack_1e0->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              local_1e8 = (undefined1  [8])0x0;
              (*pSStack_1e0->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar1 = &pSStack_1e0->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
                (*pSStack_1e0->_vptr_SharedPtrStateBase[1])();
              }
              pSStack_1e0 = (SharedPtrStateBase *)0x0;
            }
          }
          createCompositeBuffer<float>((SpirVAssembly *)local_1e8,local_18c);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)&local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)local_1e8);
          if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &pSStack_1e0->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              local_1e8 = (undefined1  [8])0x0;
              (*pSStack_1e0->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar1 = &pSStack_1e0->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              if (pSStack_1e0 != (SharedPtrStateBase *)0x0) {
                (*pSStack_1e0->_vptr_SharedPtrStateBase[1])();
              }
              pSStack_1e0 = (SharedPtrStateBase *)0x0;
            }
          }
          local_38 = compareFloats;
          numberToString<float>((string *)local_1e8,local_18c);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"constValue","");
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_138,&local_1b8);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          goto LAB_0056efca;
        }
      }
      if (iVar7 == 1) {
        specializeDefaultOutputShaderTemplate
                  ((string *)local_1e8,type,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_138);
        std::__cxx11::string::_M_assign((string *)local_f8);
        if (local_1e8 != (undefined1  [8])&local_1d8) {
          operator_delete((void *)local_1e8,local_1d8._M_allocated_capacity + 1);
        }
        this_00 = (SpvAsmComputeShaderCase *)operator_new(0x140);
        SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
                  (this_00,local_180,"initialized","OpVariable initializer tests.",
                   (ComputeShaderSpec *)local_f8,COMPUTE_TEST_USES_NONE);
      }
      else {
        local_1d8._M_allocated_capacity = 0;
        local_1e8 = (undefined1  [8])0x0;
        pSStack_1e0 = (SharedPtrStateBase *)0x0;
        local_1d8._8_8_ = &pSStack_1e0;
        sStack_1c0 = 0;
        local_1c8 = (_Base_ptr)local_1d8._8_8_;
        specializeDefaultOutputShaderTemplate
                  (&local_1b8,type,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1e8);
        std::__cxx11::string::_M_assign((string *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1e8);
        local_38 = passthruVerify;
        this_00 = (SpvAsmComputeShaderCase *)operator_new(0x140);
        SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
                  (this_00,local_180,"uninitialized","OpVariable initializer tests.",
                   (ComputeShaderSpec *)local_f8,COMPUTE_TEST_USES_NONE);
      }
      tcu::TestNode::addChild(local_198,(TestNode *)this_00);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      if (local_78 != (pointer)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
      std::
      vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
      ::~vector(&local_a0);
      std::
      vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
      ::~vector(&local_b8);
      if ((undefined1 *)local_f8._32_8_ != local_f8 + 0x30) {
        operator_delete((void *)local_f8._32_8_,local_f8._48_8_ + 1);
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      iVar7 = iVar7 + -1;
    } while (iVar7 == 0);
    tcu::TestNode::addChild(local_188,local_198);
    uVar6 = extraout_RDX_00;
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
      uVar6 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_02;
    }
    this_01 = (SpirVAssembly *)(ulong)(type + TYPE_UINT);
    if (type + TYPE_UINT == 3) {
      return (TestCaseGroup *)local_188;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createShaderDefaultOutputGroup (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, "shader_default_output", "Test shader default output."));
	de::Random						rnd		(deStringHash(group->getName()));

	for (int type = TYPE_INT; type != TYPE_END; ++type)
	{
		NumberType						numberType	= NumberType(type);
		const string					typeName	= getNumberTypeName(numberType);
		const string					description	= "Test the OpVariable initializer with " + typeName + ".";
		de::MovePtr<tcu::TestCaseGroup>	subGroup	(new tcu::TestCaseGroup(testCtx, typeName.c_str(), description.c_str()));

		// 2 similar subcases (initialized and uninitialized)
		for (int subCase = 0; subCase < 2; ++subCase)
		{
			ComputeShaderSpec spec;
			spec.numWorkGroups = IVec3(1, 1, 1);

			map<string, string>				params;

			switch (numberType)
			{
				case TYPE_INT:
				{
					deInt32 number = getInt(rnd);
					spec.inputs.push_back(createCompositeBuffer<deInt32>(number));
					spec.outputs.push_back(createCompositeBuffer<deInt32>(number));
					params["constValue"] = numberToString(number);
					break;
				}
				case TYPE_UINT:
				{
					deUint32 number = rnd.getUint32();
					spec.inputs.push_back(createCompositeBuffer<deUint32>(number));
					spec.outputs.push_back(createCompositeBuffer<deUint32>(number));
					params["constValue"] = numberToString(number);
					break;
				}
				case TYPE_FLOAT:
				{
					float number = rnd.getFloat();
					spec.inputs.push_back(createCompositeBuffer<float>(number));
					spec.outputs.push_back(createCompositeBuffer<float>(number));
					spec.verifyIO = &compareFloats;
					params["constValue"] = numberToString(number);
					break;
				}
				default:
					DE_ASSERT(false);
			}

			// Initialized subcase
			if (!subCase)
			{
				spec.assembly = specializeDefaultOutputShaderTemplate(numberType, params);
				subGroup->addChild(new SpvAsmComputeShaderCase(testCtx, "initialized", "OpVariable initializer tests.", spec));
			}
			// Uninitialized subcase
			else
			{
				spec.assembly = specializeDefaultOutputShaderTemplate(numberType);
				spec.verifyIO = &passthruVerify;
				subGroup->addChild(new SpvAsmComputeShaderCase(testCtx, "uninitialized", "OpVariable initializer tests.", spec));
			}
		}
		group->addChild(subGroup.release());
	}
	return group.release();
}